

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_STRIN_Test::Body(iu_AssertionTest_x_iutest_x_STRIN_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_16d8;
  Fixed local_16a8;
  undefined1 local_1520 [8];
  AssertionResult iutest_ar_11;
  Fixed local_14c8;
  undefined1 local_1340 [8];
  AssertionResult iutest_ar_10;
  Fixed local_12e8;
  undefined1 local_1160 [8];
  AssertionResult iutest_ar_9;
  Fixed local_1108;
  undefined1 local_f80 [8];
  AssertionResult iutest_ar_8;
  Fixed local_f28;
  undefined1 local_da0 [8];
  AssertionResult iutest_ar_7;
  Fixed local_d48;
  undefined1 local_bc0 [8];
  AssertionResult iutest_ar_6;
  Fixed local_b68;
  undefined1 local_9e0 [8];
  AssertionResult iutest_ar_5;
  Fixed local_988;
  undefined1 local_800 [8];
  AssertionResult iutest_ar_4;
  Fixed local_7a8;
  undefined1 local_620 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5c8;
  undefined1 local_440 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3e8;
  undefined1 local_260 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_230;
  Fixed local_200;
  undefined1 local_78 [8];
  AssertionResult iutest_ar;
  allocator<char> local_39;
  string local_38 [8];
  string str;
  char test [5];
  iu_AssertionTest_x_iutest_x_STRIN_Test *this_local;
  
  str.field_2._M_local_buf[0xc] = '\0';
  str.field_2._8_4_ = 0x74736574;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,str.field_2._M_local_buf + 8,&local_39);
  std::allocator<char>::~allocator(&local_39);
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperSTRIN<char[4],char[5]>
            ((AssertionResult *)local_78,(iuutil *)"\"tes\"","test","tes",
             (char (*) [4])((long)&str.field_2 + 8),(char (*) [5])in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_78);
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
               ,0x13a,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_200);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRIN<char[4],char[5]>
              ((AssertionResult *)local_260,(iuutil *)"\"tes\"","test","tes",
               (char (*) [4])((long)&str.field_2 + 8),(char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_260);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13b,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRIN<char[4],char[5]>
              ((AssertionResult *)local_440,(iuutil *)"\"tes\"","test","tes",
               (char (*) [4])((long)&str.field_2 + 8),(char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
    if (!bVar1) {
      memset(&local_5c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_440);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13c,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5c8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_440);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRIN<char[4],char[5]>
              ((AssertionResult *)local_620,(iuutil *)"\"tes\"","test","tes",
               (char (*) [4])((long)&str.field_2 + 8),(char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
    if (!bVar1) {
      memset(&local_7a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7a8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_620);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_4.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13d,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_7a8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7a8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_620);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      iuutil::CmpHelperSTRIN<char[5],char[5]>
                ((AssertionResult *)local_800,(iuutil *)"\"test\"","test","test",
                 (char (*) [5])((long)&str.field_2 + 8),(char (*) [5])in_R9);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
      if (!bVar1) {
        memset(&local_988,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_988);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_800);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_5.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                   ,0x13f,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_988);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_988);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_800);
      if (iutest_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRIN<char[5],char[5]>
                  ((AssertionResult *)local_9e0,(iuutil *)"\"test\"","test","test",
                   (char (*) [5])((long)&str.field_2 + 8),(char (*) [5])in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
        if (!bVar1) {
          memset(&local_b68,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_b68);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9e0);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_6.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x140,pcVar2,kNonFatalFailure);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_b68);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_b68);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRIN<char[5],char[5]>
                  ((AssertionResult *)local_bc0,(iuutil *)"\"test\"","test","test",
                   (char (*) [5])((long)&str.field_2 + 8),(char (*) [5])in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
        if (!bVar1) {
          memset(&local_d48,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_d48);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bc0);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_7.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x141,pcVar2,kWarning);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_d48);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_d48);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRIN<char[5],char[5]>
                  ((AssertionResult *)local_da0,(iuutil *)"\"test\"","test","test",
                   (char (*) [5])((long)&str.field_2 + 8),(char (*) [5])in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
        if (!bVar1) {
          memset(&local_f28,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_f28);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_da0);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_8.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x142,pcVar2,kAssumeFailure);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_f28);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_f28);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
        if (iutest_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          iuutil::CmpHelperSTRIN<char[4],std::__cxx11::string>
                    ((AssertionResult *)local_f80,(iuutil *)"\"tes\"","str","tes",
                     (char (*) [4])local_38,in_R9);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
          if (!bVar1) {
            memset(&local_1108,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1108);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f80);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_9.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x144,pcVar2,kFatalFailure);
            iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_9.m_result,&local_1108)
            ;
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_9.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1108);
          }
          iutest_ar_1._37_3_ = 0;
          iutest_ar_1._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
          if (iutest_ar_1._36_4_ == 0) {
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRIN<char[4],std::__cxx11::string>
                      ((AssertionResult *)local_1160,(iuutil *)"\"tes\"","str","tes",
                       (char (*) [4])local_38,in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1160);
            if (!bVar1) {
              memset(&local_12e8,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_12e8);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1160);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_10.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x145,pcVar2,kNonFatalFailure);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_10.m_result,&local_12e8);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_10.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_12e8);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1160);
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRIN<char[4],std::__cxx11::string>
                      ((AssertionResult *)local_1340,(iuutil *)"\"tes\"","str","tes",
                       (char (*) [4])local_38,in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1340);
            if (!bVar1) {
              memset(&local_14c8,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_14c8);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1340);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_11.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x146,pcVar2,kWarning);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_11.m_result,&local_14c8);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_11.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_14c8);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1340);
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRIN<char[4],std::__cxx11::string>
                      ((AssertionResult *)local_1520,(iuutil *)"\"tes\"","str","tes",
                       (char (*) [4])local_38,in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1520);
            if (!bVar1) {
              memset(&local_16a8,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_16a8);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1520);
              iutest::AssertionHelper::AssertionHelper
                        (&local_16d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x147,pcVar2,kAssumeFailure);
              iutest::AssertionHelper::operator=(&local_16d8,&local_16a8);
              iutest::AssertionHelper::~AssertionHelper(&local_16d8);
              iutest::AssertionHelper::Fixed::~Fixed(&local_16a8);
            }
            iutest_ar_1._37_3_ = 0;
            iutest_ar_1._36_1_ = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1520);
            if (iutest_ar_1._36_4_ == 0) {
              iutest_ar_1._36_4_ = 0;
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

IUTEST(AssertionTest, STRIN)
{
    const char test[] = "test";
    ::std::string str = test;
    IUTEST_ASSERT_STRIN("tes", test);
    IUTEST_EXPECT_STRIN("tes", test);
    IUTEST_INFORM_STRIN("tes", test);
    IUTEST_ASSUME_STRIN("tes", test);

    IUTEST_ASSERT_STRIN("test", test);
    IUTEST_EXPECT_STRIN("test", test);
    IUTEST_INFORM_STRIN("test", test);
    IUTEST_ASSUME_STRIN("test", test);

    IUTEST_ASSERT_STRIN("tes", str);
    IUTEST_EXPECT_STRIN("tes", str);
    IUTEST_INFORM_STRIN("tes", str);
    IUTEST_ASSUME_STRIN("tes", str);
}